

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void absl::lts_20250127::str_format_internal::anon_unknown_0::RemoveExtraPrecision
               (size_t extra_digits,bool has_leftover_value,Buffer *out,int *exp_out)

{
  anon_class_24_3_54bfc8fa local_48;
  undefined1 local_29;
  int *piStack_28;
  bool needs_to_round_up;
  int *exp_out_local;
  Buffer *out_local;
  size_t sStack_10;
  bool has_leftover_value_local;
  size_t extra_digits_local;
  
  out->end = out->end + -extra_digits;
  local_48.out = (Buffer **)&exp_out_local;
  local_48.has_leftover_value = (bool *)((long)&out_local + 7);
  local_48.extra_digits = &stack0xfffffffffffffff0;
  piStack_28 = exp_out;
  exp_out_local = (int *)out;
  out_local._7_1_ = has_leftover_value;
  sStack_10 = extra_digits;
  local_29 = RemoveExtraPrecision::anon_class_24_3_54bfc8fa::operator()(&local_48);
  if ((bool)local_29) {
    RoundUp<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
              ((Buffer *)exp_out_local,piStack_28);
  }
  return;
}

Assistant:

void RemoveExtraPrecision(size_t extra_digits,
                          bool has_leftover_value,
                          Buffer* out,
                          int* exp_out) {
  // Back out the extra digits
  out->end -= extra_digits;

  bool needs_to_round_up = [&] {
    // We look at the digit just past the end.
    // There must be 'extra_digits' extra valid digits after end.
    if (*out->end > '5') return true;
    if (*out->end < '5') return false;
    if (has_leftover_value || std::any_of(out->end + 1, out->end + extra_digits,
                                          [](char c) { return c != '0'; }))
      return true;

    // Ends in ...50*, round to even.
    return out->last_digit() % 2 == 1;
  }();

  if (needs_to_round_up) {
    RoundUp<FormatStyle::Precision>(out, exp_out);
  }
}